

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::RunContext::~RunContext(RunContext *this)

{
  int iVar1;
  IStreamingReporter *pIVar2;
  TestRunStats local_70;
  RunContext *local_10;
  RunContext *this_local;
  
  (this->super_IResultCapture)._vptr_IResultCapture = (_func_int **)&PTR__RunContext_0034cf90;
  (this->super_IRunner)._vptr_IRunner = (_func_int **)&DAT_0034d000;
  local_10 = this;
  pIVar2 = Ptr<Catch::IStreamingReporter>::operator->(&this->m_reporter);
  iVar1 = (*(this->super_IResultCapture)._vptr_IResultCapture[0xb])();
  TestRunStats::TestRunStats(&local_70,&this->m_runInfo,&this->m_totals,(bool)((byte)iVar1 & 1));
  (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[0xf])(pIVar2,&local_70);
  TestRunStats::~TestRunStats(&local_70);
  TestCaseTracking::TrackerContext::~TrackerContext(&this->m_trackerContext);
  std::
  vector<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
  ::~vector(&this->m_activeSections);
  std::vector<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_>::~vector
            (&this->m_unfinishedSections);
  AssertionInfo::~AssertionInfo(&this->m_lastAssertionInfo);
  std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::~vector(&this->m_messages);
  Ptr<Catch::IStreamingReporter>::~Ptr(&this->m_reporter);
  Ptr<const_Catch::IConfig>::~Ptr(&this->m_config);
  AssertionResult::~AssertionResult(&this->m_lastResult);
  TestRunInfo::~TestRunInfo(&this->m_runInfo);
  IRunner::~IRunner(&this->super_IRunner);
  IResultCapture::~IResultCapture(&this->super_IResultCapture);
  return;
}

Assistant:

virtual ~RunContext() {
            m_reporter->testRunEnded( TestRunStats( m_runInfo, m_totals, aborting() ) );
        }